

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetOutputDir
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *config)

{
  string *psVar1;
  undefined1 local_40 [8];
  string dir;
  string *config_local;
  cmNinjaTargetGenerator *this_local;
  
  dir.field_2._8_8_ = config;
  cmGeneratorTarget::GetDirectory
            ((string *)local_40,(this->super_cmCommonTargetGenerator).GeneratorTarget,config,
             RuntimeBinaryArtifact);
  psVar1 = ConvertToNinjaPath(this,(string *)local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetOutputDir(
  const std::string& config) const
{
  std::string dir = this->GeneratorTarget->GetDirectory(config);
  return this->ConvertToNinjaPath(dir);
}